

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O2

void __thiscall
CreateCharacterState::processSelectCharacter
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  GameData *this_00;
  element_type *name;
  Connection *pCVar1;
  Player *this_01;
  bool bVar2;
  uint uVar3;
  int id;
  ostream *poVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  string *psVar7;
  shared_ptr<GameData> *game_data;
  GameStates local_2ca;
  shared_ptr<Player> player;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  characters;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_288;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_278;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_268;
  string local_258;
  string local_238 [32];
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  bVar2 = std::operator==(input,"N");
  if ((bVar2) || (bVar2 = std::operator==(input,"n"), bVar2)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    for (p_Var5 = (this->m_race_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->m_race_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      poVar4 = (ostream *)std::ostream::operator<<(local_1a8,p_Var5[1]._M_color);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)&(p_Var5[1]._M_parent)->_M_right);
      std::operator<<(poVar4,"\r\n");
    }
    std::operator<<(local_1a8,"Choose a race\r\n");
    std::__cxx11::stringbuf::str();
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_268,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
    Sender::Send(&local_1d8,(shared_ptr<Connection> *)&local_268);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
    std::__cxx11::string::~string((string *)&local_1d8);
    player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         Connection::GetID((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_state_map,(key_type *)&player);
    *pmVar6 = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  this_00 = (this->super_GameState).game_data.
            super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Connection::GetUsername_abi_cxx11_
            ((string *)&player,
             (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  GameData::GetAccount((Account *)&ss,this_00,(string *)&player);
  Account::GetCharacters_abi_cxx11_(&characters,(Account *)&ss);
  Account::~Account((Account *)&ss);
  std::__cxx11::string::~string((string *)&player);
  std::__cxx11::string::string((string *)&local_1f8,(string *)input);
  bVar2 = Utils::IsNumber(&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&ss,(input->_M_dataplus)._M_p,(allocator *)&player);
    uVar3 = std::__cxx11::stoi((string *)&ss,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&ss);
    if ((0 < (int)uVar3) &&
       ((ulong)uVar3 <=
        (ulong)((long)characters.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)characters.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5))) {
      std::__cxx11::string::string
                ((string *)&ss,
                 (string *)
                 (characters.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((ulong)uVar3 - 1)));
      game_data = &(this->super_GameState).game_data;
      name = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string(local_238,(string *)&ss);
      GameData::GetPlayer((GameData *)&player,(string *)name);
      std::__cxx11::string::~string(local_238);
      this_01 = (Player *)
                CONCAT44(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                         (int)player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      id = Connection::GetID((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr);
      Player::SetID(this_01,id);
      Connection::SetPlayer
                ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 &player);
      pCVar1 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar7 = Player::GetPlayerName_abi_cxx11_
                         ((Player *)
                          CONCAT44(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr._4_4_,
                                   (int)player.
                                        super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr));
      Connection::SetCharacterName(pCVar1,psVar7);
      pCVar1 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar7 = Player::GetPlayerClass_abi_cxx11_
                         ((Player *)
                          CONCAT44(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr._4_4_,
                                   (int)player.
                                        super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr));
      Connection::SetCharacterClass(pCVar1,psVar7);
      pCVar1 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar7 = Player::GetPlayerRaceStr_abi_cxx11_
                         ((Player *)
                          CONCAT44(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr._4_4_,
                                   (int)player.
                                        super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr));
      Connection::SetCharacterRace(pCVar1,psVar7);
      std::__cxx11::string::string
                ((string *)&local_258,"Character Selected\r\n",(allocator *)&local_2ca);
      std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_288,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)
      ;
      Sender::Send(&local_258,(shared_ptr<Connection> *)&local_288);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
      std::__cxx11::string::~string((string *)&local_258);
      local_2ca = PLAYING;
      Connection::SetState
                ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 &local_2ca,game_data);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar7 = (string *)&ss;
      goto LAB_00167adc;
    }
  }
  std::__cxx11::string::string((string *)&local_218,"Invalid Selection\n",(allocator *)&ss);
  std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_278,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
  Sender::Send(&local_218,(shared_ptr<Connection> *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
  psVar7 = &local_218;
LAB_00167adc:
  std::__cxx11::string::~string((string *)psVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&characters);
  return;
}

Assistant:

void CreateCharacterState::processSelectCharacter(const std::string &input, std::shared_ptr<Connection> connection) {
    if(input == "N" or input == "n") {
        std::stringstream ss;
        for(const auto& race : m_race_map)
        {
            ss << race.first << " " << race.second->getRace_name() << "\r\n";
        }
        ss << "Choose a race\r\n";
        Sender::Send(ss.str(), connection);
        m_state_map[connection->GetID()] = CHOOSE_RACE;
    }
    else {
        // validate entry
        auto characters = game_data->GetAccount(connection->GetUsername()).GetCharacters();
        int selection = 0;
        if(Utils::IsNumber(input))
            selection = std::stoi(input.c_str());
        if(selection < 1 or selection > characters.size())
        {
            Sender::Send("Invalid Selection\n", connection);
        }
        else {
            std::string character = characters[selection - 1];
            std::shared_ptr<Player> player = game_data->GetPlayer(character);
            player->SetID(connection->GetID());
            connection->SetPlayer(player);
            connection->SetCharacterName(player->GetPlayerName());
            connection->SetCharacterClass(player->GetPlayerClass());
            connection->SetCharacterRace(player->GetPlayerRaceStr());
            Sender::Send("Character Selected\r\n", connection);
            connection->SetState(GameStates::PLAYING, game_data);
        }
    }
}